

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithLogTestImplicitGeneratedOutOfDate2::Run(BuildWithLogTestImplicitGeneratedOutOfDate2 *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  VirtualFileSystem *this_00;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  string err;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildWithLogTestImplicitGeneratedOutOfDate2 *pBStack_10;
  int fail_count;
  BuildWithLogTestImplicitGeneratedOutOfDate2 *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_
              ,
              "rule touch-implicit-dep-out\n  command = touch $test_dependency ; sleep 1 ; touch $out\n  generator = 1\nbuild out.imp: touch-implicit-dep-out | inimp inimp2\n  test_dependency = inimp\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"inimp",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create
              (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out.imp",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    VirtualFileSystem::Create
              (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
    VirtualFileSystem::Tick(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"inimp2",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(this_00,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    VirtualFileSystem::Tick(&(this->super_BuildWithLogTest).super_BuildTest.fs_);
    std::__cxx11::string::string((string *)local_140);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"out.imp",&local_161);
    pNVar5 = Builder::AddTarget(&(this->super_BuildWithLogTest).super_BuildTest.builder_,&local_160,
                                (string *)local_140);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d4,"builder_.AddTarget(\"out.imp\", &err)");
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    pTVar1 = g_current_test;
    bVar3 = Builder::AlreadyUpToDate(&(this->super_BuildWithLogTest).super_BuildTest.builder_);
    testing::Test::Check
              (pTVar1,(bool)(~bVar3 & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d5,"builder_.AlreadyUpToDate()");
    pTVar1 = g_current_test;
    bVar3 = Builder::Build(&(this->super_BuildWithLogTest).super_BuildTest.builder_,
                           (string *)local_140);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d7,"builder_.Build(&err)");
    pTVar1 = g_current_test;
    bVar3 = Builder::AlreadyUpToDate(&(this->super_BuildWithLogTest).super_BuildTest.builder_);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5d8,"builder_.AlreadyUpToDate()");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_);
    State::Reset(&(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.
                  state_);
    Builder::Cleanup(&(this->super_BuildWithLogTest).super_BuildTest.builder_);
    Plan::Reset(&(this->super_BuildWithLogTest).super_BuildTest.builder_.plan_);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"out.imp",&local_189);
    pNVar5 = Builder::AddTarget(&(this->super_BuildWithLogTest).super_BuildTest.builder_,&local_188,
                                (string *)local_140);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5df,"builder_.AddTarget(\"out.imp\", &err)");
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    pTVar1 = g_current_test;
    bVar3 = Builder::AlreadyUpToDate(&(this->super_BuildWithLogTest).super_BuildTest.builder_);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5e0,"builder_.AlreadyUpToDate()");
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"out.imp",&local_1b1);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_1b0);
    bVar3 = Node::dirty(pNVar5);
    testing::Test::Check
              (pTVar1,(bool)(~bVar3 & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x5e1,"GetNode(\"out.imp\")->dirty()");
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::__cxx11::string::~string((string *)local_140);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, ImplicitGeneratedOutOfDate2) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch-implicit-dep-out\n"
"  command = touch $test_dependency ; sleep 1 ; touch $out\n"
"  generator = 1\n"
"build out.imp: touch-implicit-dep-out | inimp inimp2\n"
"  test_dependency = inimp\n"));
  fs_.Create("inimp", "");
  fs_.Create("out.imp", "");
  fs_.Tick();
  fs_.Create("inimp2", "");
  fs_.Tick();

  string err;

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());
  EXPECT_FALSE(GetNode("out.imp")->dirty());
}